

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

bool __thiscall
ON_OBSOLETE_V5_DimExtra::Write(ON_OBSOLETE_V5_DimExtra *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,2);
  if (((bVar1) && (bVar1 = ON_BinaryArchive::WriteUuid(archive,&this->m_partent_uuid), bVar1)) &&
     (bVar1 = ON_BinaryArchive::WriteInt(archive,this->m_arrow_position), bVar1)) {
    if (this->m_text_rects == (ON_OBSOLETE_V5_RECT *)0x0) {
      bVar2 = false;
      bVar1 = ON_BinaryArchive::WriteInt(archive,0);
      if (!bVar1) goto LAB_004bddf9;
    }
    else {
      ON_BinaryArchive::WriteInt(archive,7);
      bVar1 = ON_BinaryArchive::WriteInt(archive,0x1c,&this->m_text_rects->left);
      if (!bVar1) goto LAB_004bddf7;
    }
    bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_distance_scale);
    if (bVar1) {
      bVar2 = ON_BinaryArchive::WriteUuid(archive,&this->m_detail_measured);
      goto LAB_004bddf9;
    }
  }
LAB_004bddf7:
  bVar2 = false;
LAB_004bddf9:
  bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
  return (bool)(bVar1 & bVar2);
}

Assistant:

bool ON_OBSOLETE_V5_DimExtra::Write(ON_BinaryArchive& archive) const
{
  int major_version = 1;
  int minor_version = 2;
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,major_version,minor_version);

  if(rc) rc = archive.WriteUuid( m_partent_uuid);
  if(rc) rc = archive.WriteInt( m_arrow_position);
  if(rc)
  {
    if( m_text_rects)
    {
      rc = archive.WriteInt( 7);
      rc = archive.WriteInt( 28, (const int*)m_text_rects);
    }
    else
      rc = archive.WriteInt( 0);

  }
  // 21 June 2010 Added distance scale, minor version 1
  if(rc) rc = archive.WriteDouble(m_distance_scale);

  // 27 Aug, 2014 Added detail measured, minor version 2
  if (rc) rc = archive.WriteUuid(m_detail_measured);

  if(!archive.EndWrite3dmChunk())
    rc = false;

  return rc;
}